

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O3

Array * __thiscall tf::TaskQueue<tf::Node_*>::Array::resize(Array *this,int64_t b,int64_t t)

{
  ulong uVar1;
  long lVar2;
  Array *pAVar3;
  atomic<tf::Node_*> *__s;
  int64_t i;
  
  pAVar3 = (Array *)operator_new(0x18);
  lVar2 = this->C;
  pAVar3->C = lVar2 * 2;
  uVar1 = lVar2 * 2 - 1;
  pAVar3->M = uVar1;
  __s = (atomic<tf::Node_*> *)operator_new__(-(ulong)((ulong)(lVar2 * 2) >> 0x3d != 0) | lVar2 << 4)
  ;
  if (lVar2 != 0) {
    memset(__s,0,lVar2 << 4);
  }
  pAVar3->S = __s;
  if (t != b) {
    do {
      __s[uVar1 & t]._M_b._M_p = this->S[this->M & t]._M_b._M_p;
      t = t + 1;
    } while (b != t);
  }
  return pAVar3;
}

Assistant:

Array* resize(int64_t b, int64_t t) {
      Array* ptr = new Array {2*C};
      for(int64_t i=t; i!=b; ++i) {
        ptr->push(i, pop(i));
      }
      return ptr;
    }